

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapper::removeMapping(QDataWidgetMapper *this,QWidget *widget)

{
  QDataWidgetMapperPrivate *this_00;
  int iVar1;
  
  this_00 = *(QDataWidgetMapperPrivate **)(this + 8);
  iVar1 = QDataWidgetMapperPrivate::findWidget(this_00,widget);
  if (iVar1 != -1) {
    std::
    vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
    ::erase(&this_00->widgetMap,
            (this_00->widgetMap).
            super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
            ._M_impl.super__Vector_impl_data._M_start + iVar1);
    QObject::removeEventFilter(&widget->super_QObject);
    return;
  }
  return;
}

Assistant:

void QDataWidgetMapper::removeMapping(QWidget *widget)
{
    Q_D(QDataWidgetMapper);

    int idx = d->findWidget(widget);
    if (idx == -1)
        return;

    d->widgetMap.erase(d->widgetMap.begin() + idx);
    widget->removeEventFilter(d->delegate);
}